

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 col;
  ImU32 col_00;
  undefined7 extraout_var;
  long lVar8;
  ImGuiCol idx;
  uint uVar9;
  undefined1 in_register_00001204 [12];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar22;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [12];
  int iVar28;
  undefined1 auVar26 [16];
  float fVar29;
  float fVar30;
  bool held;
  bool hovered;
  bool local_fa;
  bool local_f9;
  ImRect local_f8;
  float local_dc;
  undefined1 local_d8 [16];
  float local_c0;
  ImDrawCornerFlags local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined1 local_48 [16];
  undefined1 auVar27 [16];
  
  pIVar6 = GImGui;
  local_d8._4_12_ = in_register_00001204;
  local_d8._0_4_ = size_avail_v;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar29 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar30 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar29 <= 0.0) {
      return false;
    }
    if (fVar30 <= 0.0) {
      return false;
    }
    local_dc = 1.0;
    if (axis == ImGuiAxis_Y) {
      fVar12 = (GImGui->Style).FramePadding.y;
      fVar12 = fVar12 + fVar12;
      if (fVar30 < fVar12 + GImGui->FontSize) {
        fVar12 = (fVar30 - GImGui->FontSize) / fVar12;
        local_dc = 1.0;
        if (fVar12 <= 1.0) {
          local_dc = fVar12;
        }
        local_dc = (float)(~-(uint)(fVar12 < 0.0) & (uint)local_dc);
      }
    }
    if (0.0 < local_dc) {
      iVar24 = (int)((fVar29 + -2.0) * 0.5);
      iVar28 = (int)((fVar30 + -2.0) * 0.5);
      auVar15._0_4_ = -(uint)(iVar24 < 0);
      auVar15._4_4_ = -(uint)(iVar28 < 0);
      auVar15._8_8_ = 0;
      auVar26._0_4_ = -(uint)(3 < iVar24);
      auVar26._4_4_ = -(uint)(3 < iVar28);
      auVar26._8_8_ = 0;
      auVar13._0_8_ = CONCAT44((float)iVar28,(float)iVar24) ^ 0x8000000080000000;
      auVar13._8_4_ = 0x80000000;
      auVar13._12_4_ = 0x80000000;
      auVar16 = auVar15 & _DAT_00285650 | ~auVar15 & (auVar26 & _DAT_00285640 | ~auVar26 & auVar13);
      fVar30 = auVar16._0_4_;
      fVar12 = auVar16._4_4_;
      auVar17._0_8_ = auVar16._0_8_;
      auVar17._8_4_ = fVar30;
      auVar17._12_4_ = fVar12;
      local_f8.Min.x = (bb_frame->Min).x;
      local_f8.Min.y = (bb_frame->Min).y;
      local_f8.Max.x = (bb_frame->Max).x;
      local_f8.Max.y = (bb_frame->Max).y;
      fVar29 = local_f8.Min.x - fVar30;
      fVar22 = local_f8.Min.y - fVar12;
      auVar5._4_4_ = local_f8.Max.x + fVar30;
      auVar5._0_4_ = local_f8.Min.y + fVar12;
      auVar14._12_4_ = local_f8.Max.y + fVar12;
      auVar5._8_4_ = auVar14._12_4_;
      auVar4._4_8_ = auVar17._8_8_;
      auVar4._0_4_ = local_f8.Min.y + fVar12;
      auVar18._0_8_ = auVar4._0_8_ << 0x20;
      auVar18._8_4_ = local_f8.Max.x + fVar30;
      auVar18._12_4_ = auVar14._12_4_;
      local_f8.Max = auVar18._8_8_;
      local_f8.Min.y = fVar22;
      local_f8.Min.x = fVar29;
      auVar16._8_8_ = auVar5._4_8_;
      if (axis == ImGuiAxis_X) {
        auVar16._0_8_ = auVar16._8_8_;
      }
      else {
        auVar14._4_4_ = auVar14._12_4_;
        auVar14._0_4_ = auVar14._12_4_;
        auVar14._8_4_ = auVar14._12_4_;
        auVar16 = auVar14;
        fVar29 = fVar22;
      }
      local_b8._4_12_ = auVar16._4_12_;
      local_b8._0_4_ = auVar16._0_4_ - fVar29;
      local_88 = (ImVec2 *)CONCAT44(in_XMM1_Db,size_contents_v);
      auVar19._0_4_ = -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v;
      auVar19._4_4_ = in_register_00001204._0_4_ & in_XMM1_Db;
      auVar19._8_4_ = in_register_00001204._4_4_ & in_XMM1_Dc;
      auVar19._12_4_ = in_register_00001204._8_4_ & in_XMM1_Dd;
      local_98 = ZEXT416(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v) | auVar19;
      local_bc = rounding_corners;
      if (local_98._0_4_ <= 0.0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,900,"ScrollbarEx","ImGui ASSERT FAILED: %s",
                    "ImMax(size_contents_v, size_avail_v) > 0.0f");
      }
      if (local_98._0_4_ <= 1.0) {
        local_98._0_4_ = 0x3f800000;
      }
      fVar30 = local_b8._0_4_;
      fVar12 = (local_d8._0_4_ / local_98._0_4_) * fVar30;
      fVar29 = (pIVar6->Style).GrabMinSize;
      if (fVar12 <= fVar30) {
        fVar30 = fVar12;
      }
      uVar9 = -(uint)(fVar12 < fVar29);
      local_98._4_4_ = ~local_d8._4_4_ & local_b8._4_4_;
      local_98._0_4_ = uVar9 & (uint)fVar29 | ~uVar9 & (uint)fVar30;
      local_98._8_4_ = ~local_d8._8_4_ & local_b8._8_4_;
      local_98._12_4_ = ~local_d8._12_4_ & local_b8._12_4_;
      local_fa = false;
      local_f9 = false;
      bVar7 = ButtonBehavior(&local_f8,id,&local_f9,&local_fa,0x4000);
      fVar29 = local_b8._0_4_;
      auVar25 = ZEXT812(0x3f800000);
      if (1.0 <= (float)local_88 - (float)local_d8._0_4_) {
        auVar25._4_8_ = 0;
        auVar25._0_4_ = (float)local_88 - (float)local_d8._0_4_;
      }
      auVar27._12_4_ = 0;
      auVar27._0_12_ = auVar25;
      auVar23._4_4_ = *p_scroll_v;
      auVar23._0_4_ = local_98._0_4_;
      auVar23._8_4_ = local_98._4_4_;
      auVar23._12_4_ = 0;
      auVar10._4_4_ = auVar25._0_4_;
      auVar10._0_4_ = fVar29;
      auVar10._8_4_ = local_b8._4_4_;
      auVar10._12_4_ = 0;
      auVar16 = divps(auVar23,auVar10);
      fVar12 = auVar16._4_4_;
      iVar24 = -(uint)(auVar16._0_4_ < 1.0);
      auVar3._4_4_ = iVar24;
      auVar3._0_4_ = iVar24;
      auVar3._8_4_ = -(uint)(fVar12 < 0.0);
      auVar3._12_4_ = -(uint)(fVar12 < 0.0);
      uVar9 = movmskpd((int)CONCAT71(extraout_var,bVar7),auVar3);
      fVar30 = 0.0;
      if (((uVar9 & 2) == 0) && (fVar30 = 1.0, fVar12 <= 1.0)) {
        fVar30 = fVar12;
      }
      local_88 = &bb_frame->Max;
      auVar11._4_12_ = local_b8._4_12_;
      auVar11._0_4_ = fVar29 - (float)local_98._0_4_;
      local_d8 = ZEXT416((uint)((fVar30 * auVar11._0_4_) / fVar29));
      if (((1.0 <= local_dc) && ((uVar9 & 1) != 0)) && (local_fa != false)) {
        local_48 = auVar11;
        local_78 = auVar27;
        local_68 = auVar16;
        local_a8._0_8_ = (long)axis;
        lVar8 = (long)axis;
        if (1 < (uint)axis) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
          lVar8 = local_a8._0_8_;
        }
        fVar29 = (&local_f8.Min.x)[lVar8];
        if (1 < (uint)axis) {
          local_c0 = fVar29;
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
          lVar8 = local_a8._0_8_;
          fVar29 = local_c0;
        }
        auVar20 = ZEXT812(0x3f800000);
        fVar29 = (*(float *)((pIVar6->IO).MouseDown + lVar8 * 4 + -8) - fVar29) / local_b8._0_4_;
        if (fVar29 <= auVar20._0_4_) {
          auVar20._4_8_ = auVar20._4_8_;
          auVar20._0_4_ = fVar29;
        }
        local_a8._0_4_ = ~-(uint)(fVar29 < 0.0) & auVar20._0_4_;
        local_a8._4_4_ = 0;
        local_a8._8_4_ = auVar20._8_4_;
        local_a8._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar6->ActiveIdIsJustActivated == true) {
          bVar2 = (float)local_68._0_4_ + (float)local_d8._0_4_ < (float)local_a8._0_4_;
          bVar7 = bVar2 || (float)local_a8._0_4_ < (float)local_d8._0_4_;
          fVar29 = 0.0;
          if (!bVar2 && (float)local_a8._0_4_ >= (float)local_d8._0_4_) {
            fVar29 = (float)local_68._0_4_ * -0.5 + ((float)local_a8._0_4_ - (float)local_d8._0_4_);
          }
          pIVar6->ScrollbarClickDeltaToGrabCenter = fVar29;
        }
        else {
          bVar7 = false;
        }
        auVar21 = ZEXT812(0x3f800000);
        fVar30 = (((float)local_a8._0_4_ - pIVar6->ScrollbarClickDeltaToGrabCenter) -
                 (float)local_68._0_4_ * 0.5) / (1.0 - (float)local_68._0_4_);
        fVar29 = 1.0;
        if (fVar30 <= 1.0) {
          fVar29 = fVar30;
        }
        fVar29 = (float)(int)((float)(~-(uint)(fVar30 < 0.0) & (uint)fVar29) * (float)local_78._0_4_
                             + 0.5);
        *p_scroll_v = fVar29;
        fVar29 = fVar29 / (float)local_78._0_4_;
        if (fVar29 <= auVar21._0_4_) {
          auVar21._4_8_ = auVar21._4_8_;
          auVar21._0_4_ = fVar29;
        }
        local_d8._0_4_ =
             ((float)local_48._0_4_ * (float)(~-(uint)(fVar29 < 0.0) & auVar21._0_4_)) /
             (float)local_b8._0_4_;
        local_d8._4_4_ = local_48._4_4_;
        local_d8._8_4_ = local_48._8_4_;
        local_d8._12_4_ = local_48._12_4_;
        if (bVar7) {
          pIVar6->ScrollbarClickDeltaToGrabCenter =
               -(float)local_68._0_4_ * 0.5 + ((float)local_a8._0_4_ - (float)local_d8._0_4_);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (local_fa == false) {
        idx = (local_f9 & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_dc);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,local_88,col,pIVar1->WindowRounding,local_bc);
      if (axis == ImGuiAxis_X) {
        local_58.x = local_f8.Min.x + (local_f8.Max.x - local_f8.Min.x) * (float)local_d8._0_4_;
        IStack_50.x = (float)local_98._0_4_ + local_58.x;
        local_58.y = local_f8.Min.y;
        IStack_50.y = local_f8.Max.y;
      }
      else {
        local_58.y = (local_f8.Max.y - local_f8.Min.y) * (float)local_d8._0_4_ + local_f8.Min.y;
        IStack_50.x = local_f8.Max.x;
        IStack_50.y = (float)local_98._0_4_ + local_58.y;
        local_58.x = local_f8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_58,&IStack_50,col_00,(pIVar6->Style).ScrollbarRounding,0xf)
      ;
      return local_fa;
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}